

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

void synchronize(void)

{
  int iVar1;
  
  synchronize_nowait();
  iVar1 = step;
  while (iVar1 == step) {
    uv_cond_wait(&condvar,&mutex);
  }
  if (step == iVar1 + 1) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
          ,0x68,"step == current + 1");
  abort();
}

Assistant:

static void synchronize(void) {
  int current;

  synchronize_nowait();
  /* Wait for the other thread.  Guard against spurious wakeups. */
  for (current = step; current == step; uv_cond_wait(&condvar, &mutex));
  ASSERT(step == current + 1);
}